

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedStruct.hpp
# Opt level: O0

ParsedStruct * __thiscall ParsedStruct::operator=(ParsedStruct *this,ParsedStruct *oldStruct)

{
  ParsedStruct *oldStruct_local;
  ParsedStruct *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)oldStruct);
  std::__cxx11::string::operator=((string *)&this->havingCond,(string *)&oldStruct->havingCond);
  std::__cxx11::string::operator=((string *)&this->groupAttr,(string *)&oldStruct->groupAttr);
  std::__cxx11::string::operator=((string *)&this->aggFunc,(string *)&oldStruct->aggFunc);
  std::__cxx11::string::operator=
            ((string *)&this->selectCondVect,(string *)&oldStruct->selectCondVect);
  return this;
}

Assistant:

ParsedStruct& operator=(const ParsedStruct& oldStruct)
    {
        this->selectAttr = oldStruct.selectAttr;
        this->havingCond = oldStruct.havingCond;
        this->groupAttr = oldStruct.groupAttr;
        this->aggFunc = oldStruct.aggFunc;
        this->selectCondVect = oldStruct.selectCondVect;
        return *this;
    }